

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identifyInlinableBlocks.cpp
# Opt level: O2

void identifyInlinableBlocks(Module *module,Program *program)

{
  pointer ppEVar1;
  bool bVar2;
  Func *this;
  Block *pBVar3;
  long lVar4;
  Module *pMVar5;
  BasicBlock *pBVar6;
  Module *f;
  Function *pFVar7;
  
  for (pMVar5 = module + 0x20; pMVar5 = *(Module **)pMVar5, pMVar5 != module + 0x18;
      pMVar5 = pMVar5 + 8) {
    f = pMVar5 + -0x38;
    if (pMVar5 == (Module *)0x0) {
      f = (Module *)0x0;
    }
    this = Program::getFunction(program,(Function *)f);
    for (pFVar7 = (Function *)f + 0x50; pFVar7 = *(Function **)pFVar7,
        pFVar7 != (Function *)f + 0x48; pFVar7 = pFVar7 + 8) {
      pBVar6 = (BasicBlock *)(pFVar7 + -0x18);
      if (pFVar7 == (Function *)0x0) {
        pBVar6 = (BasicBlock *)0x0;
      }
      pBVar3 = Func::createBlockIfNotExist(this,pBVar6);
      lVar4 = llvm::BasicBlock::getSinglePredecessor();
      bVar2 = true;
      if (lVar4 == 0) {
        ppEVar1 = (pBVar3->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((long)(pBVar3->expressions).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppEVar1 == 8) {
          bVar2 = RetExpr::classof(*ppEVar1);
        }
        else {
          bVar2 = false;
        }
      }
      pBVar3->doInline = bVar2;
    }
    pFVar7 = *(Function **)((Function *)f + 0x50);
    if (pFVar7 != (Function *)f + 0x48) {
      pBVar6 = (BasicBlock *)(pFVar7 + -0x18);
      if (pFVar7 == (Function *)0x0) {
        pBVar6 = (BasicBlock *)0x0;
      }
      pBVar3 = Func::createBlockIfNotExist(this,pBVar6);
      pBVar3->doInline = false;
      pBVar3->isFirst = true;
    }
  }
  Program::addPass(program,IdentifyInlinableBlocks);
  return;
}

Assistant:

void identifyInlinableBlocks(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateExpressions));
    assert(program.isPassCompleted(PassType::ParseBreaks));

    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->createBlockIfNotExist(&block);
            myBlock->doInline = isSafeToInline(&block, myBlock);
        }

        if (func.begin() == func.end())
            continue;

        // first block is only inlinable if there are no predecessors
        auto& firstBlock = *func.begin();
        auto* myBlock = function->createBlockIfNotExist(&firstBlock);

        myBlock->doInline = false;
        myBlock->isFirst = true;
    }

    program.addPass(PassType::IdentifyInlinableBlocks);
}